

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.h
# Opt level: O3

void __thiscall GameLogic::GameLogic(GameLogic *this)

{
  list<ItemInfo,_std::allocator<ItemInfo>_> *plVar1;
  list<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_> *plVar2;
  _Rb_tree_header *p_Var3;
  
  IDManager::IDManager(&this->idManager);
  (this->mapInfo).wards.super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mapInfo;
  (this->mapInfo).wards.super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mapInfo;
  (this->mapInfo).wards.super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
  _M_size = 0;
  plVar1 = &(this->mapInfo).bombs;
  (this->mapInfo).bombs.super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->mapInfo).bombs.super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->mapInfo).bombs.super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
  _M_size = 0;
  plVar2 = &(this->mapInfo).deaths;
  (this->mapInfo).deaths.super__List_base<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->mapInfo).deaths.super__List_base<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->mapInfo).deaths.super__List_base<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_>.
  _M_impl._M_node._M_size = 0;
  (this->playerID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->playerID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->playerID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var3 = &(this->unitInfo)._M_t._M_impl.super__Rb_tree_header;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->unitInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->commands).super__Vector_base<Command,_std::allocator<Command>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->commands).super__Vector_base<Command,_std::allocator<Command>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commands).super__Vector_base<Command,_std::allocator<Command>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actions).
  super__Vector_base<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actions).
  super__Vector_base<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->playerIDMgr)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->actions).
  super__Vector_base<std::pair<int,_Action>,_std::allocator<std::pair<int,_Action>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->jsoncmd)._M_dataplus._M_p = (pointer)&(this->jsoncmd).field_2;
  (this->jsoncmd)._M_string_length = 0;
  (this->jsoncmd).field_2._M_local_buf[0] = '\0';
  this->logicStat = NotInitialized;
  return;
}

Assistant:

GameLogic() { logicStat = NotInitialized; }